

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

array_container_t * array_container_from_run(run_container_t *arr)

{
  uint16_t uVar1;
  ushort uVar2;
  rle16_t *prVar3;
  uint16_t *puVar4;
  int32_t iVar5;
  int iVar6;
  array_container_t *paVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  
  iVar6 = run_container_cardinality(arr);
  paVar7 = array_container_create_given_capacity(iVar6);
  paVar7->cardinality = 0;
  iVar6 = arr->n_runs;
  if (0 < (long)iVar6) {
    prVar3 = arr->runs;
    puVar4 = paVar7->array;
    lVar8 = 0;
    iVar5 = paVar7->cardinality;
    do {
      iVar11 = iVar5;
      uVar1 = prVar3[lVar8].value;
      uVar2 = prVar3[lVar8].length;
      lVar10 = 0;
      do {
        puVar4[iVar11 + lVar10] = uVar1 + (short)lVar10;
        lVar10 = lVar10 + 1;
        iVar9 = (int)lVar10;
      } while (uVar2 + 1 != iVar9);
      lVar8 = lVar8 + 1;
      iVar5 = iVar11 + iVar9;
    } while (lVar8 != iVar6);
    paVar7->cardinality = iVar11 + iVar9;
  }
  return paVar7;
}

Assistant:

array_container_t *array_container_from_run(const run_container_t *arr) {
    array_container_t *answer =
        array_container_create_given_capacity(run_container_cardinality(arr));
    answer->cardinality = 0;
    for (int rlepos = 0; rlepos < arr->n_runs; ++rlepos) {
        int run_start = arr->runs[rlepos].value;
        int run_end = run_start + arr->runs[rlepos].length;

        for (int run_value = run_start; run_value <= run_end; ++run_value) {
            answer->array[answer->cardinality++] = (uint16_t)run_value;
        }
    }
    return answer;
}